

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Hokuyo.h
# Opt level: O2

int FindHokuyoMessage(char *buf,int buflen,char **pFoundMsg,int *pFoundMsgTmpLen)

{
  int iVar1;
  
  *pFoundMsg = buf;
  *pFoundMsgTmpLen = buflen;
  do {
    iVar1 = AnalyzeHokuyoMessage(buf,buflen);
    if (iVar1 == 0) {
      return 0;
    }
    buf = *pFoundMsg + 1;
    *pFoundMsg = buf;
    iVar1 = *pFoundMsgTmpLen;
    buflen = iVar1 + -1;
    *pFoundMsgTmpLen = buflen;
  } while (0x1d < iVar1);
  *pFoundMsg = (char *)0x0;
  *pFoundMsgTmpLen = 0;
  return 1;
}

Assistant:

inline int FindHokuyoMessage(char* buf, int buflen, char** pFoundMsg, int* pFoundMsgTmpLen)
{
	*pFoundMsg = buf;
	*pFoundMsgTmpLen = buflen;

	while (AnalyzeHokuyoMessage(*pFoundMsg, *pFoundMsgTmpLen) != EXIT_SUCCESS)
	{
		(*pFoundMsg)++;
		(*pFoundMsgTmpLen)--;
		if (*pFoundMsgTmpLen < MIN_STANDARD_BUF_LEN_HOKUYO)
		{
			*pFoundMsg = NULL;
			*pFoundMsgTmpLen = 0;
			return EXIT_FAILURE;
		}
	}

	return EXIT_SUCCESS;
}